

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O1

CCFunc * __thiscall asmjit::CodeCompiler::addFunc(CodeCompiler *this,CCFunc *func)

{
  CBNode *pCVar1;
  
  if (this->_func == (CCFunc *)0x0) {
    this->_func = func;
    CodeBuilder::addNode(&this->super_CodeBuilder,(CBNode *)func);
    pCVar1 = (this->super_CodeBuilder)._cursor;
    CodeBuilder::addNode(&this->super_CodeBuilder,&func->_exitNode->super_CBNode);
    CodeBuilder::addNode(&this->super_CodeBuilder,&func->_end->super_CBNode);
    (this->super_CodeBuilder)._cursor = pCVar1;
    return func;
  }
  addFunc();
}

Assistant:

CCFunc* CodeCompiler::addFunc(CCFunc* func) {
  ASMJIT_ASSERT(_func == nullptr);
  _func = func;

  addNode(func);                 // Function node.
  CBNode* cursor = getCursor();  // {CURSOR}.
  addNode(func->getExitNode());  // Function exit label.
  addNode(func->getEnd());       // Function end marker.

  _setCursor(cursor);
  return func;
}